

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O2

Result<wasm::Ok> * __thiscall
wasm::WATParser::ParseDefsCtx::withLoc<wasm::Ok>
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *this,Index pos,
          Result<wasm::Ok> *res)

{
  string local_68;
  Err local_48;
  
  if ((res == (Result<wasm::Ok> *)0x0) ||
     (*(__index_type *)
       ((long)&(res->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) != '\x01')) {
    std::__detail::__variant::_Move_ctor_base<false,_wasm::Ok,_wasm::Err>::_Move_ctor_base
              ((_Move_ctor_base<false,_wasm::Ok,_wasm::Err> *)__return_storage_ptr__,
               (_Move_ctor_base<false,_wasm::Ok,_wasm::Err> *)res);
  }
  else {
    std::__cxx11::string::string((string *)&local_68,(string *)res);
    Lexer::err(&local_48,&this->in,(ulong)pos,&local_68);
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
    _Variant_storage<1ul,wasm::Err>
              ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<T> withLoc(Index pos, Result<T> res) {
    if (auto err = res.getErr()) {
      return in.err(pos, err->msg);
    }
    return res;
  }